

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O2

vector3d * __thiscall
tinyusdz::value::MultV<tinyusdz::value::matrix4d,tinyusdz::value::vector3d,double,double,3ul>
          (vector3d *__return_storage_ptr__,value *this,matrix4d *m,vector3d *v)

{
  size_t j;
  long lVar1;
  long lVar2;
  Ty value;
  double dVar3;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    dVar3 = 0.0;
    for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
      dVar3 = dVar3 + *(double *)(this + lVar2 * 4) * *(double *)((long)m->m[0] + lVar2);
    }
    (&__return_storage_ptr__->x)[lVar1] = dVar3;
    this = this + 8;
  }
  return __return_storage_ptr__;
}

Assistant:

VTy MultV(const MTy &m, const VTy &v) {
  // MBaseTy must be float or double
  // TODO: use std::enable_if?
  static_assert(std::is_same<MBaseTy, double>::value || std::is_same<MBaseTy, float>::value,
    "Matrix element type must be `float` or `double`");

  // Intermediate type. Choose higher precision based on its size.
  typedef typename std::conditional<sizeof(MBaseTy) >= sizeof(VBaseTy), MBaseTy, VBaseTy>::type Ty;

  VTy ret;

  for (size_t j = 0; j < N; j++) {
    Ty value = static_cast<Ty>(0);
    for (size_t i = 0; i < N; i++) {
      value += static_cast<Ty>(m.m[i][j]) * static_cast<Ty>(v[i]);
    }
    ret[j] = static_cast<VBaseTy>(value);
  }

  return ret;
}